

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

int __thiscall
CVmObjHTTPRequest::getp_getBody
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  vm_obj_id_t vVar2;
  int in_root_set;
  vm_httpreq_ext *pvVar3;
  TadsHttpRequestHeader *this_00;
  vm_val_t *in_RDX;
  CVmNetFile *in_RDI;
  int mode;
  vm_val_t charset;
  CVmStringRefSource *sbody;
  StringRef *body;
  TadsHttpRequestHeader *hdrs;
  TadsHttpRequest *req;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  uint *in_stack_ffffffffffffff70;
  vm_val_t *in_stack_ffffffffffffff78;
  vm_val_t *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  undefined4 in_stack_ffffffffffffffa0;
  
  if ((getp_getBody(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_getBody(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_getBody::desc,0);
    __cxa_guard_release(&getp_getBody(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                     (CVmNativeCodeDesc *)
                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  if (iVar1 == 0) {
    pvVar3 = get_ext((CVmObjHTTPRequest *)in_RDI);
    iVar1 = (int)((ulong)in_RDX >> 0x20);
    if (pvVar3->req->overflow == 0) {
      if (pvVar3->req->body == (StringRef *)0x0) {
        vm_val_t::set_nil(in_RDX);
      }
      else {
        this_00 = (TadsHttpRequestHeader *)operator_new(0x28);
        CVmStringRefSource::CVmStringRefSource
                  ((CVmStringRefSource *)
                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),(StringRef *)in_RDI
                  );
        TadsHttpRequestHeader::find(this_00,(char *)in_stack_ffffffffffffff70);
        in_root_set = get_charset_map((char *)in_RDI,in_stack_ffffffffffffff80);
        vVar2 = (vm_obj_id_t)((ulong)in_stack_ffffffffffffff80 >> 0x20);
        CVmStack::push((vm_val_t *)&stack0xffffffffffffff98);
        vVar2 = CVmObjFile::create(in_root_set,in_RDI,vVar2,(CVmDataSource *)this_00,iVar1,
                                   (int)in_RDX,in_stack_ffffffffffffffa0);
        vm_val_t::set_obj(in_RDX,vVar2);
        CVmStack::discard();
      }
    }
    else {
      vVar2 = CVmObjString::create
                        (iVar1,(char *)in_stack_ffffffffffffff78,(size_t)in_stack_ffffffffffffff70);
      vm_val_t::set_obj(in_RDX,vVar2);
    }
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_getBody(VMG_ vm_obj_id_t self,
                                    vm_val_t *retval, uint *oargc)
{
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* retrieve the headers from the request */
    TadsHttpRequest *req = get_ext()->req;
    TadsHttpRequestHeader *hdrs = req->hdr_list;
    StringRef *body = req->body;

    /* if the body was too large, return 'overflow' */
    if (req->overflow)
    {
        retval->set_obj(CVmObjString::create(vmg_ FALSE, "overflow", 8));
        return TRUE;
    }

    /* if there's no body, return nil */
    if (body == 0)
    {
        retval->set_nil();
        return TRUE;
    }

    /* create a data source for the body */
    CVmStringRefSource *sbody = new CVmStringRefSource(body);

    /* for a text content type, get the character mapper */
    vm_val_t charset;
    int mode = get_charset_map(vmg_ hdrs->find("content-type"), &charset);
    G_stk->push(&charset);

    /* create a File object to access the body data source */
    retval->set_obj(CVmObjFile::create(
        vmg_ FALSE, 0, charset.val.obj, sbody, mode,
        VMOBJFILE_ACCESS_READ, TRUE));

    /* discard the gc protection */
    G_stk->discard();
                                       
    /* handled */
    return TRUE;
}